

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_add_from_range(array_container_t *arr,uint32_t min,uint32_t max,uint16_t step)

{
  undefined4 local_20;
  uint32_t value;
  uint16_t step_local;
  uint32_t max_local;
  uint32_t min_local;
  array_container_t *arr_local;
  
  for (local_20 = min; local_20 < max; local_20 = step + local_20) {
    array_container_append(arr,(uint16_t)local_20);
  }
  return;
}

Assistant:

void array_container_add_from_range(array_container_t *arr, uint32_t min,
                                    uint32_t max, uint16_t step) {
    for (uint32_t value = min; value < max; value += step) {
        array_container_append(arr, value);
    }
}